

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

QMap<int,_QMultiMap<QByteArray,_int>_> __thiscall
Generator::methodsWithAutomaticTypesHelper(Generator *this,QList<FunctionDef> *methodList)

{
  bool bVar1;
  QMultiMap<QByteArray,_int> *this_00;
  long lVar2;
  long lVar3;
  long in_RDX;
  QByteArray *propertyType;
  long in_FS_OFFSET;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->parser = (Moc *)0x0;
  local_3c = 0;
  if (*(long *)(in_RDX + 0x10) != 0) {
    lVar3 = 0;
    do {
      local_40 = 0;
      if (*(long *)(*(long *)(in_RDX + 8) + 0x50 + lVar3 * 0xd0) != 0) {
        lVar3 = *(long *)(in_RDX + 8) + lVar3 * 0xd0;
        lVar2 = 0;
        do {
          propertyType = (QByteArray *)(*(long *)(lVar3 + 0x48) + lVar2 * 0xa8 + 0x58);
          bVar1 = registerableMetaType((Generator *)methodList,propertyType);
          if (bVar1) {
            bVar1 = isBuiltinType(propertyType);
            if (!bVar1) {
              this_00 = QMap<int,_QMultiMap<QByteArray,_int>_>::operator[]
                                  ((QMap<int,_QMultiMap<QByteArray,_int>_> *)this,&local_3c);
              QMultiMap<QByteArray,_int>::insert(this_00,propertyType,&local_40);
            }
          }
          lVar2 = (long)local_40 + 1;
          local_40 = (int)lVar2;
        } while (lVar2 < *(long *)(lVar3 + 0x50));
      }
      lVar3 = (long)local_3c + 1;
      local_3c = (int)lVar3;
    } while (lVar3 < *(long *)(in_RDX + 0x10));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMultiMap<QByteArray,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_QMultiMap<QByteArray,_int>_>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMap<int, QMultiMap<QByteArray, int>>
Generator::methodsWithAutomaticTypesHelper(const QList<FunctionDef> &methodList)
{
    QMap<int, QMultiMap<QByteArray, int> > methodsWithAutomaticTypes;
    for (int i = 0; i < methodList.size(); ++i) {
        const FunctionDef &f = methodList.at(i);
        for (int j = 0; j < f.arguments.size(); ++j) {
            const QByteArray &argType = f.arguments.at(j).normalizedType;
            if (registerableMetaType(argType) && !isBuiltinType(argType))
                methodsWithAutomaticTypes[i].insert(argType, j);
        }
    }
    return methodsWithAutomaticTypes;
}